

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe37At5(uint8_t *buf)

{
  return (ulong)((uint)buf[3] | (uint)buf[4] << 8 | (buf[5] & 3) << 0x10) << 0x13 |
         (ulong)((uint)buf[2] * 0x800 + (uint)buf[1] * 8) | (ulong)(*buf >> 5);
}

Assistant:

std::uint64_t readFlUIntLe37At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[0] >> 5);
    res &= UINT64_C(0x1fffffffff);
    return res;
}